

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

StatusCode __thiscall HttpConn::processRequest(HttpConn *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  LogStream *pLVar4;
  long lVar5;
  char *__arg;
  undefined8 uVar6;
  ssize_t sVar7;
  char *pcVar8;
  bool local_134a;
  allocator local_1301;
  string local_1300;
  allocator local_12d9;
  key_type local_12d8;
  allocator<char> local_12b1;
  string local_12b0 [8];
  string sum;
  char local_1288 [4];
  int len;
  char res [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  undefined1 local_1248 [8];
  string path;
  string local_1220;
  undefined1 local_1200 [8];
  string y;
  string local_11d8;
  undefined1 local_11b8 [8];
  string x;
  int pipefd [2];
  pid_t pid;
  bool exist;
  undefined1 local_1168 [8];
  string pwd;
  string local_1140;
  undefined1 local_1120 [8];
  string name;
  key_type local_10f8;
  allocator local_10d1;
  key_type local_10d0;
  Logger local_10b0;
  allocator local_d1;
  key_type local_d0;
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  key_type local_a8;
  allocator local_81;
  key_type local_80;
  _Self local_60 [3];
  allocator local_41;
  key_type local_40;
  _Self local_20;
  HttpConn *local_18;
  HttpConn *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Connection",&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->headers_,&local_40);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->headers_);
  bVar1 = std::operator!=(&local_20,local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_aa = 0;
    local_ab = 0;
    std::__cxx11::string::string((string *)&local_80,"Connection",&local_81);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->headers_,&local_80);
    bVar1 = std::operator==(pmVar3,"keep-alive");
    local_134a = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_aa = 1;
      std::__cxx11::string::string((string *)&local_a8,"Connection",&local_a9);
      local_ab = 1;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->headers_,&local_a8);
      local_134a = std::operator==(pmVar3,"Keep-Alive");
    }
    if ((local_ab & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a8);
    }
    if ((local_aa & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    if (local_134a != false) {
      this->linger_ = true;
    }
  }
  pcVar8 = "close";
  if ((this->linger_ & 1U) != 0) {
    pcVar8 = "keep-alive";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"Connection",&local_d1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->outputHeaders_,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar3,pcVar8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if (this->method_ == Head) {
    Logger::Logger(&local_10b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/HttpConn.cpp"
                   ,0x136);
    pLVar4 = Logger::stream(&local_10b0);
    pLVar4 = LogStream::operator<<(pLVar4,"Processing HEAD request from ");
    LogStream::operator<<(pLVar4,&this->from_);
    Logger::~Logger(&local_10b0);
    this_local._4_4_ = OK;
  }
  else if (this->method_ == Get) {
    bVar1 = std::operator==(&this->path_,"/hello");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->body_,"Hello World");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10d0,"Content-Type",&local_10d1);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->outputHeaders_,&local_10d0);
      std::__cxx11::string::operator=((string *)pmVar3,"text/plain");
      std::__cxx11::string::~string((string *)&local_10d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
      this_local._4_4_ = OK;
    }
    else {
      bVar1 = std::operator==(&this->path_,"/");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->path_,"/index.html");
      }
      this_local._4_4_ = handleFile(this,&this->path_);
    }
  }
  else if (this->method_ == Post) {
    bVar1 = std::operator==(&this->path_,"/signup");
    if ((bVar1) || (bVar1 = std::operator==(&this->path_,"/login"), bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_10f8,"Content-Type",(allocator *)(name.field_2._M_local_buf + 0xf)
                );
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->outputHeaders_,&local_10f8);
      std::__cxx11::string::operator=((string *)pmVar3,"text/plain");
      std::__cxx11::string::~string((string *)&local_10f8);
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1140,"username",(allocator *)(pwd.field_2._M_local_buf + 0xf));
      findInBody((string *)local_1120,this,&local_1140);
      std::__cxx11::string::~string((string *)&local_1140);
      std::allocator<char>::~allocator((allocator<char> *)(pwd.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&pid,"password",(allocator *)((long)pipefd + 7));
      findInBody((string *)local_1168,this,(string *)&pid);
      std::__cxx11::string::~string((string *)&pid);
      std::allocator<char>::~allocator((allocator<char> *)((long)pipefd + 7));
      pipefd[1]._2_1_ = WebServer::existUser(this->server_,(string *)local_1120);
      bVar1 = std::operator==(&this->path_,"/signup");
      if (bVar1) {
        if ((pipefd[1]._2_1_ & 1) == 0) {
          WebServer::updateUser(this->server_,(string *)local_1120,(string *)local_1168);
          std::__cxx11::string::operator=((string *)&this->body_,"Successful signup!");
        }
        else {
          std::__cxx11::string::operator=((string *)&this->body_,"Username Exists!");
        }
      }
      bVar1 = std::operator==(&this->path_,"/login");
      if (bVar1) {
        if (((pipefd[1]._2_1_ & 1) == 0) ||
           (bVar1 = WebServer::verifyUser(this->server_,(string *)local_1120,(string *)local_1168),
           !bVar1)) {
          std::__cxx11::string::operator=((string *)&this->body_,"Wrong username or wrong password")
          ;
        }
        else {
          std::__cxx11::string::operator=((string *)&this->body_,"Successful login!");
        }
      }
      this_local._4_4_ = OK;
      std::__cxx11::string::~string((string *)local_1168);
      std::__cxx11::string::~string((string *)local_1120);
    }
    else {
      lVar5 = std::__cxx11::string::find((char *)&this->path_,0x175c5f);
      if ((lVar5 != -1) &&
         (lVar5 = std::__cxx11::string::find((char *)&this->path_,0x175c64), lVar5 != -1)) {
        iVar2 = pipe((int *)(x.field_2._M_local_buf + 8));
        if (iVar2 != 0) {
          return InternalError;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_11d8,"x",(allocator *)(y.field_2._M_local_buf + 0xf));
        findInBody((string *)local_11b8,this,&local_11d8);
        std::__cxx11::string::~string((string *)&local_11d8);
        std::allocator<char>::~allocator((allocator<char> *)(y.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1220,"y",(allocator *)(path.field_2._M_local_buf + 0xf));
        findInBody((string *)local_1200,this,&local_1220);
        std::__cxx11::string::~string((string *)&local_1220);
        std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
        std::operator+(&local_1268,&root_abi_cxx11_,"/..");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1248,&local_1268,&this->path_);
        std::__cxx11::string::~string((string *)&local_1268);
        pipefd[0] = fork();
        if (pipefd[0] < 0) {
          this_local._4_4_ = InternalError;
          bVar1 = true;
        }
        else if (pipefd[0] == 0) {
          ::close(x.field_2._8_4_);
          dup2(x.field_2._12_4_,1);
          ::close(x.field_2._12_4_);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          __arg = (char *)std::__cxx11::string::c_str();
          uVar6 = std::__cxx11::string::c_str();
          execl(pcVar8,__arg,uVar6,0);
          bVar1 = false;
        }
        else {
          ::close(x.field_2._12_4_);
          sVar7 = ::read(x.field_2._8_4_,local_1288,1);
          sum.field_2._12_4_ = ZEXT14(sVar7 < 0);
          if (sVar7 < 0) {
            this_local._4_4_ = InternalError;
            bVar1 = true;
          }
          else {
            lVar5 = (long)(int)sum.field_2._12_4_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<char*,void>
                      (local_12b0,local_1288,local_1288 + lVar5,&local_12b1);
            std::allocator<char>::~allocator(&local_12b1);
            std::__cxx11::string::operator=((string *)&this->body_,local_12b0);
            printf("%d %d %d\n",(ulong)(uint)x.field_2._8_4_,(ulong)(uint)x.field_2._12_4_,
                   (ulong)(uint)sum.field_2._12_4_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_12d8,"Content-Type",&local_12d9);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->outputHeaders_,&local_12d8);
            std::__cxx11::string::operator=((string *)pmVar3,"text/plain");
            std::__cxx11::string::~string((string *)&local_12d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_12d9);
            waitpid(pipefd[0],(int *)0x0,0);
            ::close(x.field_2._8_4_);
            this_local._4_4_ = OK;
            bVar1 = true;
            std::__cxx11::string::~string(local_12b0);
          }
        }
        std::__cxx11::string::~string((string *)local_1248);
        std::__cxx11::string::~string((string *)local_1200);
        std::__cxx11::string::~string((string *)local_11b8);
        if (bVar1) {
          return this_local._4_4_;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1300,"./404.html",&local_1301);
      handleFile(this,&local_1300);
      std::__cxx11::string::~string((string *)&local_1300);
      std::allocator<char>::~allocator((allocator<char> *)&local_1301);
      this_local._4_4_ = NotFound;
    }
  }
  else {
    this_local._4_4_ = BadRequest;
  }
  return this_local._4_4_;
}

Assistant:

HttpConn::StatusCode HttpConn::processRequest() {
    if (headers_.find("Connection") != headers_.end()) {
        if (headers_["Connection"] == "keep-alive" || headers_["Connection"] == "Keep-Alive") {
            linger_ = true;
        } 
    }
    outputHeaders_["Connection"] = linger_ ? "keep-alive" : "close";
    if (method_ == Head) {
        LOG << "Processing HEAD request from " << from_;
        return OK;
    } else if (method_ == Get) {
        if (path_ == "/hello") {
            body_ = "Hello World";
            outputHeaders_["Content-Type"] = "text/plain";
            return OK;
        }
        if (path_ == "/")
            path_ = "/index.html";
        // LOG << "Processing GET request from " << from_ << ": get " << path_;
        return handleFile(path_);
    } else if (method_ == Post) {
        if (path_ == "/signup" || path_ == "/login") {
            
            outputHeaders_["Content-Type"] = "text/plain";
            std::string name = findInBody("username");
            std::string pwd = findInBody("password");
            bool exist = server_->existUser(name);
            if (path_ == "/signup") {
                if (exist) body_ = "Username Exists!";
                else {
                    server_->updateUser(name, pwd);
                    body_ = "Successful signup!";
                }
            }
            if (path_ == "/login") {
                if (!exist || !server_->verifyUser(name, pwd)) body_ = "Wrong username or wrong password";
                else body_ = "Successful login!";
            }

            return OK;
        }
        //issue: pipe does not work
        if (path_.find("/cgi") != path_.npos) {
            if (path_.find("/add") != path_.npos) {
                pid_t pid;
                int pipefd[2];
                if (pipe(pipefd) != 0) 
                    return InternalError;
                std::string x = findInBody("x");
                std::string y = findInBody("y");
                std::string path = root + "/.." + path_;
                if ((pid = fork()) < 0) {
                    return InternalError;
                } else if (pid == 0) {
                    ::close(pipefd[0]);
                    dup2(pipefd[1], STDOUT_FILENO);
                    ::close(pipefd[1]);
                    execl(path.c_str(), x.c_str(), y.c_str(), NULL);
                } else {
                    ::close(pipefd[1]);
                    char res[20];
                    int len;
                    if ((len = ::read(pipefd[0], res, 1) < 0)) {
                        return InternalError; 
                    }
                    std::string sum(res, res + len);
                    body_ = sum;
                    printf("%d %d %d\n",pipefd[0], pipefd[1], len);
                    outputHeaders_["Content-Type"] = "text/plain";
                    waitpid(pid, NULL, 0);
                    ::close(pipefd[0]);
                    return OK;
                }
            }
        }
        handleFile("./404.html");
        return NotFound;

    }
    return BadRequest;
}